

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O1

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t markerIndex)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  iterator __position;
  
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < markerIndex]
      ) {
    if (*(ulong *)(p_Var2 + 1) >= markerIndex) {
      p_Var3 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (__position._M_node = p_Var3, markerIndex < *(ulong *)(p_Var3 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
     (p_Var2 = (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
     std::
     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>,std::_Select1st<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>>
     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>,std::_Select1st<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>>
                         *)&this->Markers,__position), __position._M_node == p_Var2)) {
    ReleaseExtraBuffers(this);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool BacktrackingTokenStream<Token>::ReleaseMarker(size_t markerIndex) {
    const auto iMap = Markers.find(markerIndex);
    // If not found, we fail
    if (iMap == Markers.end())
        return false;
    // Remove one marker of this value
    if (iMap == Markers.begin()) {
        Markers.erase(iMap);
        ReleaseExtraBuffers();
    } else
        Markers.erase(iMap);
    return true;
}